

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::CommandReporter::CommandReporter
          (CommandReporter *this,string *command,CommandLauncher *launcher)

{
  _func_int **in_RDX;
  string *in_RSI;
  Reporter *in_RDI;
  CommandReporter *this_00;
  
  Reporter::Reporter(in_RDI);
  in_RDI->_vptr_Reporter = (_func_int **)&PTR__CommandReporter_002991c0;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  DiffInfo::getDefaultArguments_abi_cxx11_();
  in_RDI[9]._vptr_Reporter = in_RDX;
  this_00 = (CommandReporter *)(in_RDI + 10);
  ::std::shared_ptr<ApprovalTests::ConvertForCygwin>::shared_ptr
            ((shared_ptr<ApprovalTests::ConvertForCygwin> *)0x1691aa);
  checkForCygwin(this_00);
  return;
}

Assistant:

CommandReporter::CommandReporter(std::string command, CommandLauncher* launcher)
        : cmd(std::move(command)), l(launcher)
    {
        checkForCygwin();
    }